

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# a_summon.cpp
# Opt level: O1

int AF_A_Summon(VMFrameStack *stack,VMValue *param,int numparam,VMReturn *ret,int numret)

{
  byte *pbVar1;
  VM_UBYTE VVar2;
  undefined8 *puVar3;
  player_t *ppVar4;
  PClass *pPVar5;
  int iVar6;
  undefined4 extraout_var;
  undefined8 uVar7;
  PClass *pPVar8;
  AActor *mobj;
  AInventory *this;
  AActor *pAVar9;
  PClassActor *type;
  AActor *pAVar10;
  char *__assertion;
  bool bVar11;
  FSoundID local_50;
  FName local_4c;
  DVector3 local_48;
  
  pPVar5 = AActor::RegistrationInfo.MyClass;
  if (numparam < 1) {
    __assertion = "(paramnum) < numparam";
    goto LAB_005c2e8f;
  }
  if (((param->field_0).field_3.Type == '\x03') &&
     (((param->field_0).field_1.atag == 1 || ((param->field_0).field_1.a == (void *)0x0)))) {
    pAVar9 = (AActor *)(param->field_0).field_1.a;
    if (pAVar9 != (AActor *)0x0) {
      if ((pAVar9->super_DThinker).super_DObject.Class == (PClass *)0x0) {
        iVar6 = (**(pAVar9->super_DThinker).super_DObject._vptr_DObject)(pAVar9);
        (pAVar9->super_DThinker).super_DObject.Class = (PClass *)CONCAT44(extraout_var,iVar6);
      }
      pPVar8 = (pAVar9->super_DThinker).super_DObject.Class;
      bVar11 = pPVar8 != (PClass *)0x0;
      if (pPVar8 != pPVar5 && bVar11) {
        do {
          pPVar8 = pPVar8->ParentClass;
          bVar11 = pPVar8 != (PClass *)0x0;
          if (pPVar8 == pPVar5) break;
        } while (pPVar8 != (PClass *)0x0);
      }
      if (!bVar11) {
        __assertion = "self == NULL || self->IsKindOf(RUNTIME_CLASS(AActor))";
        goto LAB_005c2e8f;
      }
    }
    pPVar5 = AActor::RegistrationInfo.MyClass;
    if ((numparam != 1) && (VVar2 = param[1].field_0.field_3.Type, VVar2 != 0xff)) {
      if ((VVar2 != '\x03') ||
         ((param[1].field_0.field_1.atag != 1 && (param[1].field_0.field_1.a != (void *)0x0))))
      goto LAB_005c2e64;
      puVar3 = (undefined8 *)param[1].field_0.field_1.a;
      if (puVar3 != (undefined8 *)0x0) {
        if (puVar3[1] == 0) {
          uVar7 = (**(code **)*puVar3)(puVar3);
          puVar3[1] = uVar7;
        }
        pPVar8 = (PClass *)puVar3[1];
        bVar11 = pPVar8 != (PClass *)0x0;
        if (pPVar8 != pPVar5 && bVar11) {
          do {
            pPVar8 = pPVar8->ParentClass;
            bVar11 = pPVar8 != (PClass *)0x0;
            if (pPVar8 == pPVar5) break;
          } while (pPVar8 != (PClass *)0x0);
        }
        if (!bVar11) {
          __assertion = "stateowner == NULL || stateowner->IsKindOf(RUNTIME_CLASS(AActor))";
          goto LAB_005c2e8f;
        }
      }
    }
    if (((numparam < 3) || (VVar2 = param[2].field_0.field_3.Type, VVar2 == 0xff)) ||
       ((VVar2 == '\x03' &&
        ((param[2].field_0.field_1.atag == 8 || (param[2].field_0.field_1.a == (void *)0x0)))))) {
      local_48.X = (pAVar9->__Pos).X;
      local_48.Y = (pAVar9->__Pos).Y;
      local_48.Z = (pAVar9->__Pos).Z;
      mobj = AActor::StaticSpawn((PClassActor *)AMinotaurFriend::RegistrationInfo.MyClass,&local_48,
                                 ALLOW_REPLACE,false);
      if (mobj != (AActor *)0x0) {
        bVar11 = P_TestMobjLocation(mobj);
        if ((bVar11) && (pAVar10 = (pAVar9->tracer).field_0.p, pAVar10 != (AActor *)0x0)) {
          if (((pAVar10->super_DThinker).super_DObject.ObjectFlags & 0x20) == 0) {
            *(int *)&mobj->field_0x49c = level.maptime;
            if (((((pAVar9->tracer).field_0.p)->flags).Value & 0x100000) == 0) {
              (mobj->tracer).field_0 = (pAVar9->tracer).field_0;
              local_48.X = 0.0;
              local_48.Y = 0.0;
              local_48.Z = 0.0;
              this = (AInventory *)
                     AActor::StaticSpawn((PClassActor *)APowerMinotaur::RegistrationInfo.MyClass,
                                         &local_48,NO_REPLACE,false);
              pAVar10 = (pAVar9->tracer).field_0.p;
              if ((pAVar10 != (AActor *)0x0) &&
                 (((pAVar10->super_DThinker).super_DObject.ObjectFlags & 0x20) != 0)) {
                (pAVar9->tracer).field_0.p = (AActor *)0x0;
                pAVar10 = (AActor *)0x0;
              }
              AInventory::CallTryPickup(this,pAVar10,(AActor **)0x0);
              ppVar4 = ((pAVar9->tracer).field_0.p)->player;
              if (ppVar4 == (player_t *)0x0) {
                mobj->FriendPlayer = '\0';
              }
              else {
                mobj->FriendPlayer = (char)((int)ppVar4 - 0xa39290U >> 5) * '=' + '\x01';
              }
            }
            else {
              (mobj->tracer).field_0.p = (AActor *)0x0;
            }
            local_4c.Index = FName::NameManager::FindName(&FName::NameData,"MinotaurSmoke",false);
            local_48.X = (pAVar9->__Pos).X;
            local_48.Y = (pAVar9->__Pos).Y;
            local_48.Z = (pAVar9->__Pos).Z;
            type = ClassForSpawn(&local_4c);
            AActor::StaticSpawn(type,&local_48,ALLOW_REPLACE,false);
            local_50.ID = (mobj->ActiveSound).super_FSoundID.ID;
            S_Sound(pAVar9,2,&local_50,1.0,1.0);
            return 0;
          }
          (pAVar9->tracer).field_0.p = (AActor *)0x0;
        }
        (*(mobj->super_DThinker).super_DObject._vptr_DObject[4])(mobj);
        local_48.X = (pAVar9->__Pos).X;
        local_48.Y = (pAVar9->__Pos).Y;
        local_48.Z = (pAVar9->__Pos).Z;
        pAVar9 = AActor::StaticSpawn((PClassActor *)AArtiDarkServant::RegistrationInfo.MyClass,
                                     &local_48,ALLOW_REPLACE,false);
        if (pAVar9 != (AActor *)0x0) {
          pbVar1 = (byte *)((long)&(pAVar9->flags).Value + 2);
          *pbVar1 = *pbVar1 | 2;
        }
      }
      return 0;
    }
    __assertion = 
    "param[paramnum].Type == REGT_POINTER && (param[paramnum].atag == ATAG_STATEINFO || param[paramnum].a == NULL)"
    ;
  }
  else {
LAB_005c2e64:
    __assertion = 
    "param[paramnum].Type == REGT_POINTER && (param[paramnum].atag == ATAG_OBJECT || param[paramnum].a == NULL)"
    ;
  }
LAB_005c2e8f:
  __assert_fail(__assertion,
                "/workspace/llm4binary/github/license_c_cmakelists/alexey-lysiuk[P]gzdoom/src/g_hexen/a_summon.cpp"
                ,0x34,"int AF_A_Summon(VMFrameStack *, VMValue *, int, VMReturn *, int)");
}

Assistant:

DEFINE_ACTION_FUNCTION(AActor, A_Summon)
{
	PARAM_ACTION_PROLOGUE;

	AMinotaurFriend *mo;

	mo = Spawn<AMinotaurFriend>(self->Pos(), ALLOW_REPLACE);
	if (mo)
	{
		if (P_TestMobjLocation(mo) == false || !self->tracer)
		{ // Didn't fit - change back to artifact
			mo->Destroy();
			AActor *arti = Spawn<AArtiDarkServant>(self->Pos(), ALLOW_REPLACE);
			if (arti) arti->flags |= MF_DROPPED;
			return 0;
		}

		mo->StartTime = level.maptime;
		if (self->tracer->flags & MF_CORPSE)
		{	// Master dead
			mo->tracer = NULL;		// No master
		}
		else
		{
			mo->tracer = self->tracer;		// Pointer to master
			AInventory *power = Spawn<APowerMinotaur>();
			power->CallTryPickup(self->tracer);
			mo->SetFriendPlayer(self->tracer->player);
		}

		// Make smoke puff
		Spawn("MinotaurSmoke", self->Pos(), ALLOW_REPLACE);
		S_Sound(self, CHAN_VOICE, mo->ActiveSound, 1, ATTN_NORM);
	}
	return 0;
}